

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::RandomizedRenderGrid
          (RandomizedRenderGrid *this,IVec2 *targetSize,IVec2 *cellSize,int maxCellCount,
          deUint32 seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  deRandom local_40;
  
  (this->m_targetSize).m_data[0] = targetSize->m_data[0];
  (this->m_targetSize).m_data[1] = targetSize->m_data[1];
  (this->m_cellSize).m_data[0] = cellSize->m_data[0];
  iVar6 = cellSize->m_data[1];
  (this->m_cellSize).m_data[1] = iVar6;
  iVar5 = targetSize->m_data[0] / cellSize->m_data[0];
  (this->m_grid).m_data[0] = iVar5;
  iVar6 = targetSize->m_data[1] / iVar6;
  (this->m_grid).m_data[1] = iVar6;
  this->m_currentCell = 0;
  iVar6 = (iVar6 - (uint)(1 < iVar6 && targetSize->m_data[1] % cellSize->m_data[1] == 0)) * iVar5;
  if (maxCellCount < iVar6) {
    iVar6 = maxCellCount;
  }
  this->m_cellCount = iVar6;
  iVar1 = targetSize->m_data[0];
  iVar2 = targetSize->m_data[1];
  iVar3 = cellSize->m_data[0];
  iVar4 = cellSize->m_data[1];
  deRandom_init(&local_40,seed);
  dVar7 = deRandom_getUint32(&local_40);
  (this->m_baseRandomOffset).m_data[0] = dVar7 % (uint)((iVar1 + 1) - iVar3 * iVar5);
  dVar7 = deRandom_getUint32(&local_40);
  (this->m_baseRandomOffset).m_data[1] =
       dVar7 % (iVar2 + (-(iVar6 / iVar5) - (uint)(iVar6 % iVar5 != 0)) * iVar4 + 1);
  return;
}

Assistant:

RandomizedRenderGrid::RandomizedRenderGrid (const IVec2& targetSize, const IVec2& cellSize, int maxCellCount, deUint32 seed)
	: m_targetSize			(targetSize)
	, m_cellSize			(cellSize)
	, m_grid				(targetSize / cellSize)
	, m_currentCell			(0)
	// If the grid exactly fits height, take one row for randomization.
	, m_cellCount			(deMin32(maxCellCount, ((targetSize.y() % cellSize.y()) == 0) && m_grid.y() > 1 ? m_grid.x() * (m_grid.y() - 1) :  m_grid.x() * m_grid.y()))
	, m_baseRandomOffset	(getRandomOffset(seed, targetSize, cellSize, m_grid, m_cellCount))
{
}